

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autowah.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_12ff03::AutowahState::deviceUpdate(AutowahState *this,ALCdevice *param_1)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->mAttackRate = 1.0;
  this->mReleaseRate = 1.0;
  this->mResonanceGain = 10.0;
  this->mPeakGain = 4.5;
  this->mFreqMinNorm = 0.00045;
  this->mBandwidthNorm = 0.05;
  lVar2 = 0;
  memset(&this->mEnvDelay,0,0x2004);
  do {
    puVar1 = (undefined8 *)((long)this->mChans[0].CurrentGains + lVar2 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mChans[0].CurrentGains + lVar2 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mChans[0].CurrentGains + lVar2 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mChans[0].CurrentGains + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this->mChans[0].CurrentGains + lVar2 + -8) = 0;
    lVar2 = lVar2 + 0x88;
  } while (lVar2 != 0x880);
  return;
}

Assistant:

void AutowahState::deviceUpdate(const ALCdevice*)
{
    /* (Re-)initializing parameters and clear the buffers. */

    mAttackRate    = 1.0f;
    mReleaseRate   = 1.0f;
    mResonanceGain = 10.0f;
    mPeakGain      = 4.5f;
    mFreqMinNorm   = 4.5e-4f;
    mBandwidthNorm = 0.05f;
    mEnvDelay      = 0.0f;

    for(auto &e : mEnv)
    {
        e.cos_w0 = 0.0f;
        e.alpha = 0.0f;
    }

    for(auto &chan : mChans)
    {
        std::fill(std::begin(chan.CurrentGains), std::end(chan.CurrentGains), 0.0f);
        chan.Filter.z1 = 0.0f;
        chan.Filter.z2 = 0.0f;
    }
}